

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagonal_precond.cc
# Opt level: O2

void __thiscall ipx::DiagonalPrecond::Factorize(DiagonalPrecond *this,double *W,Info *info)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Model *pMVar7;
  double *pdVar8;
  pointer piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  double local_20;
  
  pMVar7 = this->model_;
  uVar3 = pMVar7->num_rows_;
  uVar4 = pMVar7->num_cols_;
  this->factorized_ = false;
  if (W == (double *)0x0) {
    local_20 = 0.0;
    std::valarray<double>::operator=(&this->diagonal_,&local_20);
    uVar11 = 0;
    uVar12 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar12 = uVar11;
    }
    for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
      piVar9 = (pMVar7->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = piVar9[uVar11 + 1];
      pdVar8 = (this->diagonal_)._M_data;
      for (lVar10 = (long)piVar9[uVar11]; lVar10 < iVar5; lVar10 = lVar10 + 1) {
        dVar1 = (pMVar7->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        iVar6 = (pMVar7->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        pdVar8[iVar6] = dVar1 * dVar1 + pdVar8[iVar6];
      }
    }
  }
  else {
    pdVar8 = (this->diagonal_)._M_data;
    uVar11 = 0;
    uVar12 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar12 = uVar11;
    }
    for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      pdVar8[uVar11] = W[(long)(int)uVar4 + uVar11];
    }
    uVar11 = 0;
    uVar12 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar12 = uVar11;
    }
    for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
      dVar1 = W[uVar11];
      piVar9 = (pMVar7->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = piVar9[uVar11 + 1];
      pdVar8 = (this->diagonal_)._M_data;
      for (lVar10 = (long)piVar9[uVar11]; lVar10 < iVar5; lVar10 = lVar10 + 1) {
        dVar2 = (pMVar7->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        iVar6 = (pMVar7->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        pdVar8[iVar6] = dVar1 * dVar2 * dVar2 + pdVar8[iVar6];
      }
    }
  }
  this->factorized_ = true;
  return;
}

Assistant:

void DiagonalPrecond::Factorize(const double* W, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();

    factorized_ = false;

    // Build diagonal of normal matrix.
    if (W) {
        for (Int i = 0; i < m; i++)
            diagonal_[i] = W[n+i];
        for (Int j = 0; j < n; j++) {
            double w = W[j];
            for (Int p = AI.begin(j); p < AI.end(j); p++)
                diagonal_[AI.index(p)] += AI.value(p) * w * AI.value(p);
        }
    } else {
        diagonal_ = 0.0;        // rightmost m columns have weight zero
        for (Int j = 0; j < n; j++) {
            for (Int p = AI.begin(j); p < AI.end(j); p++)
                diagonal_[AI.index(p)] += AI.value(p) * AI.value(p);
        }
    }

    factorized_ = true;
}